

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O1

void plutovg_font_face_get_metrics
               (plutovg_font_face_t *face,float size,float *ascent,float *descent,float *line_gap,
               plutovg_rect_t *extents)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  
  uVar1 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
  fVar4 = size / (float)(ushort)(uVar1 << 8 | uVar1 >> 8);
  if (ascent != (float *)0x0) {
    *ascent = (float)face->ascent * fVar4;
  }
  if (descent != (float *)0x0) {
    *descent = (float)face->descent * fVar4;
  }
  if (line_gap != (float *)0x0) {
    *line_gap = (float)face->line_gap * fVar4;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    iVar2 = face->x1;
    extents->x = (float)iVar2 * fVar4;
    iVar3 = face->y2;
    extents->y = (float)iVar3 * -fVar4;
    extents->w = (float)(face->x2 - iVar2) * fVar4;
    extents->h = (float)(face->y1 - iVar3) * -fVar4;
  }
  return;
}

Assistant:

STBTT_DEF float stbtt_ScaleForMappingEmToPixels(const stbtt_fontinfo *info, float pixels)
{
   int unitsPerEm = ttUSHORT(info->data + info->head + 18);
   return pixels / unitsPerEm;
}